

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

float wabt::interp::FloatDiv<float>(float lhs,float rhs)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  undefined4 local_1c;
  undefined4 local_18;
  float rhs_local;
  float lhs_local;
  
  if (rhs == 0.0) {
    uVar3 = std::isnan((double)(ulong)(uint)lhs);
    if (((uVar3 & 1) == 0) && ((lhs != 0.0 || (NAN(lhs))))) {
      bVar1 = std::signbit(lhs);
      bVar2 = std::signbit(rhs);
      fVar4 = std::numeric_limits<float>::infinity();
      fVar5 = std::numeric_limits<float>::infinity();
      local_1c = -fVar4;
      if (bVar1 == bVar2) {
        local_1c = fVar5;
      }
      local_18 = local_1c;
    }
    else {
      local_18 = std::numeric_limits<float>::quiet_NaN();
    }
    rhs_local = local_18;
  }
  else {
    rhs_local = CanonNaN<float,_0>(lhs / rhs);
  }
  return rhs_local;
}

Assistant:

T WABT_VECTORCALL FloatDiv(T lhs, T rhs) {
  // IEE754 specifies what should happen when dividing a float by zero, but
  // C/C++ says it is undefined behavior.
  if (WABT_UNLIKELY(rhs == 0)) {
    return std::isnan(lhs) || lhs == 0
               ? std::numeric_limits<T>::quiet_NaN()
               : ((std::signbit(lhs) ^ std::signbit(rhs))
                      ? -std::numeric_limits<T>::infinity()
                      : std::numeric_limits<T>::infinity());
  }
  return CanonNaN(lhs / rhs);
}